

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
          (sysbvm_context_t *context,sysbvm_tuple_t astNode_,sysbvm_tuple_t expectedType_,
          sysbvm_tuple_t environment_)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t astNode__00;
  undefined1 local_80 [8];
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_56_7_b1b689e6 gcFrame;
  sysbvm_tuple_t environment__local;
  sysbvm_tuple_t expectedType__local;
  sysbvm_tuple_t astNode__local;
  sysbvm_context_t *context_local;
  
  gcFrameRecord.roots = (sysbvm_tuple_t *)astNode_;
  memset(local_80,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_LANDING_PAD;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_80);
  gcFrame.astNode = expectedType_;
  if (expectedType_ == 0) {
    gcFrame.astNode = (context->roots).decayedTypeInferenceType;
  }
  sVar1 = sysbvm_analysisAndEvaluationEnvironment_getExpectedType(context,environment_);
  sysbvm_analysisAndEvaluationEnvironment_setExpectedType(context,environment_,gcFrame.astNode);
  astNode__00 = sysbvm_interpreter_analyzeASTIfNeededWithEnvironment
                          (context,(sysbvm_tuple_t)gcFrameRecord.roots,environment_);
  sysbvm_analysisAndEvaluationEnvironment_setExpectedType(context,environment_,sVar1);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_80);
  sVar1 = sysbvm_interpreter_applyCoercionToASTNodeIntoType
                    (context,astNode__00,environment_,gcFrame.astNode);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(sysbvm_context_t *context, sysbvm_tuple_t astNode_, sysbvm_tuple_t expectedType_, sysbvm_tuple_t environment_)
{
    struct {
        sysbvm_tuple_t astNode;
        sysbvm_tuple_t expectedType;
        sysbvm_tuple_t environment;

        sysbvm_tuple_t oldExpectedType;
        sysbvm_tuple_t nodeType;
        sysbvm_tuple_t result;

        sysbvm_tuple_t coercionExpressionType;
    } gcFrame = {
        .astNode = astNode_,
        .expectedType = expectedType_,
        .environment = environment_
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    if(!gcFrame.expectedType)
        gcFrame.expectedType = context->roots.decayedTypeInferenceType;

    // Store the old expected type.
    gcFrame.oldExpectedType = sysbvm_analysisAndEvaluationEnvironment_getExpectedType(context, gcFrame.environment);
    sysbvm_analysisAndEvaluationEnvironment_setExpectedType(context, gcFrame.environment, gcFrame.expectedType);

    // Analyze the target node itself.
    gcFrame.result = sysbvm_interpreter_analyzeASTIfNeededWithEnvironment(context, gcFrame.astNode, gcFrame.environment);

    // Restore the old expected type.
    sysbvm_analysisAndEvaluationEnvironment_setExpectedType(context, gcFrame.environment, gcFrame.oldExpectedType);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return sysbvm_interpreter_applyCoercionToASTNodeIntoType(context, gcFrame.result, gcFrame.environment, gcFrame.expectedType);
}